

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

string * __thiscall
cmTarget::GetInstallNameDirForInstallTree_abi_cxx11_(string *__return_storage_ptr__,cmTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *__s;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  pcVar2 = this->Makefile;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar4 = cmMakefile::IsOn(pcVar2,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  if (bVar4) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"INSTALL_NAME_DIR","");
    __s = GetProperty(this,&local_78,this->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_SKIP_RPATH","");
    bVar4 = cmMakefile::IsOn(pcVar2,&local_78);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pcVar2 = this->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"CMAKE_SKIP_INSTALL_RPATH","");
      bVar4 = cmMakefile::IsOn(pcVar2,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar4 = !bVar4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((bool)(bVar4 ^ 1U | __s == (char *)0x0)) {
      if (__s == (char *)0x0) {
        bVar4 = MacOSXRpathInstallNameDirDefault(this);
        if (bVar4) {
          std::__cxx11::string::_M_replace
                    ((ulong)__return_storage_ptr__,0,
                     (char *)__return_storage_ptr__->_M_string_length,0x4fc7de);
        }
      }
    }
    else if (*__s != '\0') {
      pcVar3 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar3,(ulong)__s);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetInstallNameDirForInstallTree() const
{
  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if(!this->Makefile->IsOn("CMAKE_SKIP_RPATH") &&
       !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH"))
      {
      if(install_name_dir && *install_name_dir)
        {
        dir = install_name_dir;
        dir += "/";
        }
      }
    if(!install_name_dir)
      {
      if(this->MacOSXRpathInstallNameDirDefault())
        {
        dir = "@rpath/";
        }
      }
    return dir;
    }
  else
    {
    return "";
    }
}